

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::expanded_convert(jpeg_decoder *this)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint8 uVar5;
  int iVar6;
  uint uVar7;
  int cr;
  int cb;
  int y;
  int j;
  int Cr_ofs;
  int Cb_ofs;
  int Y_ofs;
  int k;
  int i;
  uint8 *d;
  uint8 *Py;
  int row;
  jpeg_decoder *this_local;
  
  uVar7 = this->m_max_mcu_y_size - this->m_mcu_lines_left;
  d = this->m_pSample_buf +
      (long)(int)((uVar7 & 7) << 3) + (long)(((int)uVar7 / 8) * 0x40 * this->m_comp_h_samp[0]);
  _k = this->m_pScan_line_0;
  for (Y_ofs = this->m_max_mcus_per_row; 0 < Y_ofs; Y_ofs = Y_ofs + -1) {
    for (Cb_ofs = 0; Cb_ofs < this->m_max_mcu_x_size; Cb_ofs = Cb_ofs + 8) {
      iVar6 = Cb_ofs * 8;
      iVar3 = this->m_expanded_blocks_per_component;
      iVar4 = this->m_expanded_blocks_per_component;
      for (cb = 0; cb < 8; cb = cb + 1) {
        uVar7 = (uint)d[iVar6 + cb];
        bVar1 = d[iVar6 + iVar3 * 0x40 + cb];
        bVar2 = d[iVar6 + iVar4 * 0x80 + cb];
        uVar5 = clamp(uVar7 + this->m_crr[(int)(uint)bVar2]);
        *_k = uVar5;
        uVar5 = clamp(uVar7 + (this->m_crg[(int)(uint)bVar2] + this->m_cbg[(int)(uint)bVar1] >> 0x10
                              ));
        _k[1] = uVar5;
        uVar5 = clamp(uVar7 + this->m_cbb[(int)(uint)bVar1]);
        _k[2] = uVar5;
        _k[3] = 0xff;
        _k = _k + 4;
      }
    }
    d = d + (this->m_expanded_blocks_per_mcu << 6);
  }
  return;
}

Assistant:

void jpeg_decoder::expanded_convert()
{
  int row = m_max_mcu_y_size - m_mcu_lines_left;

  uint8* Py = m_pSample_buf + (row / 8) * 64 * m_comp_h_samp[0] + (row & 7) * 8;

  uint8* d = m_pScan_line_0;

  for (int i = m_max_mcus_per_row; i > 0; i--)
  {
    for (int k = 0; k < m_max_mcu_x_size; k += 8)
    {
      const int Y_ofs = k * 8;
      const int Cb_ofs = Y_ofs + 64 * m_expanded_blocks_per_component;
      const int Cr_ofs = Y_ofs + 64 * m_expanded_blocks_per_component * 2;
      for (int j = 0; j < 8; j++)
      {
        int y = Py[Y_ofs + j];
        int cb = Py[Cb_ofs + j];
        int cr = Py[Cr_ofs + j];

        d[0] = clamp(y + m_crr[cr]);
        d[1] = clamp(y + ((m_crg[cr] + m_cbg[cb]) >> 16));
        d[2] = clamp(y + m_cbb[cb]);
        d[3] = 255;

        d += 4;
      }
    }

    Py += 64 * m_expanded_blocks_per_mcu;
  }
}